

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O1

int __thiscall agg::bspline::init(bspline *this,EVP_PKEY_CTX *ctx)

{
  double *pdVar1;
  double *in_RAX;
  int iVar2;
  
  iVar2 = (int)ctx;
  if ((2 < iVar2) && (this->m_max < iVar2)) {
    pod_array<double>::resize(&this->m_am,iVar2 * 3);
    this->m_max = iVar2;
    pdVar1 = (this->m_am).m_array;
    this->m_x = pdVar1 + ((ulong)ctx & 0xffffffff);
    in_RAX = pdVar1 + (uint)(iVar2 * 2);
    this->m_y = in_RAX;
  }
  this->m_num = 0;
  this->m_last_idx = -1;
  return (int)in_RAX;
}

Assistant:

void bspline::init(int max)
    {
        if(max > 2 && max > m_max)
        {
            m_am.resize(max * 3);
            m_max = max;
            m_x   = &m_am[m_max];
            m_y   = &m_am[m_max * 2];
        }
        m_num = 0;
        m_last_idx = -1;
    }